

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_range.c
# Opt level: O2

CURLcode Curl_range(Curl_easy *data)

{
  char *str;
  CURLofft CVar1;
  CURLofft CVar2;
  long lVar3;
  long lVar4;
  char *ptr;
  curl_off_t to;
  curl_off_t from;
  char *ptr2;
  
  lVar4 = 0xd8;
  lVar3 = -1;
  if ((((data->state).field_0x6d1 & 2) != 0) && (str = (data->state).range, str != (char *)0x0)) {
    CVar1 = curlx_strtoofft(str,&ptr,0,&from);
    if (CVar1 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    while (((ulong)(byte)*ptr < 0x2e && ((0x200100000200U >> ((ulong)(byte)*ptr & 0x3f) & 1) != 0)))
    {
      ptr = ptr + 1;
    }
    CVar2 = curlx_strtoofft(ptr,&ptr2,0,&to);
    if (CVar2 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    if (CVar2 == CURL_OFFT_INVAL && CVar1 == CURL_OFFT_OK) {
      lVar4 = 0x1160;
      lVar3 = from;
    }
    else {
      if (CVar1 == CURL_OFFT_INVAL && CVar2 == CURL_OFFT_OK) {
        (data->req).maxdownload = to;
        from = -to;
      }
      else {
        if (to < from) {
          return CURLE_RANGE_ERROR;
        }
        if (to - from == 0x7fffffffffffffff) {
          return CURLE_RANGE_ERROR;
        }
        (data->req).maxdownload = (to - from) + 1;
      }
      lVar4 = 0x1160;
      lVar3 = from;
    }
  }
  *(long *)((long)&data->magic + lVar4) = lVar3;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_range(struct Curl_easy *data)
{
  curl_off_t from, to;
  char *ptr;
  char *ptr2;

  if(data->state.use_range && data->state.range) {
    CURLofft from_t;
    CURLofft to_t;
    from_t = curlx_strtoofft(data->state.range, &ptr, 0, &from);
    if(from_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    while(*ptr && (ISBLANK(*ptr) || (*ptr == '-')))
      ptr++;
    to_t = curlx_strtoofft(ptr, &ptr2, 0, &to);
    if(to_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    if((to_t == CURL_OFFT_INVAL) && !from_t) {
      /* X - */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE %" CURL_FORMAT_CURL_OFF_T " to end of file",
                   from));
    }
    else if((from_t == CURL_OFFT_INVAL) && !to_t) {
      /* -Y */
      data->req.maxdownload = to;
      data->state.resume_from = -to;
      DEBUGF(infof(data, "RANGE the last %" CURL_FORMAT_CURL_OFF_T " bytes",
                   to));
    }
    else {
      /* X-Y */
      curl_off_t totalsize;

      /* Ensure the range is sensible - to should follow from. */
      if(from > to)
        return CURLE_RANGE_ERROR;

      totalsize = to - from;
      if(totalsize == CURL_OFF_T_MAX)
        return CURLE_RANGE_ERROR;

      data->req.maxdownload = totalsize + 1; /* include last byte */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE from %" CURL_FORMAT_CURL_OFF_T
                   " getting %" CURL_FORMAT_CURL_OFF_T " bytes",
                   from, data->req.maxdownload));
    }
    DEBUGF(infof(data, "range-download from %" CURL_FORMAT_CURL_OFF_T
                 " to %" CURL_FORMAT_CURL_OFF_T ", totally %"
                 CURL_FORMAT_CURL_OFF_T " bytes",
                 from, to, data->req.maxdownload));
  }
  else
    data->req.maxdownload = -1;
  return CURLE_OK;
}